

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O2

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
amrex::StateDescriptor::sameInterps
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,StateDescriptor *this,int a_scomp,int a_ncomp)

{
  InterpBase *pIVar1;
  ulong uVar2;
  pointer ppIVar3;
  InterpBase *pIVar4;
  InterpBase *pIVar5;
  ulong uVar6;
  pair<int,_int> local_38;
  
  uVar2 = (ulong)(uint)a_scomp;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = (ulong)a_scomp;
  pIVar1 = this->mapper;
  ppIVar3 = (this->mapper_comp).
            super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
            super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar4 = ppIVar3[uVar6];
  if (ppIVar3[uVar6] == (InterpBase *)0x0) {
    pIVar4 = pIVar1;
  }
  do {
    local_38.second = 1;
    while( true ) {
      uVar6 = uVar6 + 1;
      if ((long)(a_ncomp + a_scomp) <= (long)uVar6) {
        local_38.first = (int)uVar2;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,&local_38);
        return __return_storage_ptr__;
      }
      pIVar5 = ppIVar3[uVar6];
      if (ppIVar3[uVar6] == (InterpBase *)0x0) {
        pIVar5 = pIVar1;
      }
      if (pIVar4 != pIVar5) break;
      local_38.second = local_38.second + 1;
    }
    local_38.first = (int)uVar2;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_38);
    pIVar1 = this->mapper;
    ppIVar3 = (this->mapper_comp).
              super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
              super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar4 = ppIVar3[uVar6];
    if (ppIVar3[uVar6] == (InterpBase *)0x0) {
      pIVar4 = pIVar1;
    }
    uVar2 = uVar6 & 0xffffffff;
  } while( true );
}

Assistant:

std::vector< std::pair<int,int> >
StateDescriptor::sameInterps (int a_scomp,
                              int a_ncomp) const
{
    BL_ASSERT(a_scomp >= 0);
    BL_ASSERT(a_ncomp >= 1);

    std::vector< std::pair<int,int> > range;

    InterpBase* map = interp(a_scomp);

    int SComp = a_scomp, NComp = 1;

    for (int i = a_scomp+1; i < a_scomp+a_ncomp; i++)
    {
        if (map == interp(i))
        {
            NComp++;
        }
        else
        {
            range.push_back(std::pair<int,int>(SComp,NComp));

            map   = interp(i);
            SComp = i;
            NComp = 1;
        }
    }

    range.push_back(std::pair<int,int>(SComp,NComp));

#ifdef AMREX_DEBUG
    int sum = 0;
    for (int i = 0; i < static_cast<int>(range.size()); i++)
        sum += range[i].second;
    BL_ASSERT(sum == a_ncomp);
#endif

    return range;
}